

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FragmentOutputCase::~FragmentOutputCase(FragmentOutputCase *this)

{
  FragmentOutputCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FragmentOutputCase_032b38f8;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_renderbuffers);
  std::
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  ::~vector(&this->m_outputs);
  std::
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  ::~vector(&this->m_fboSpec);
  gles3::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

FragmentOutputCase::~FragmentOutputCase (void)
{
	deinit();
}